

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_encode(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  void **ppvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  opj_tcd *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  opj_image_comp_t *poVar7;
  OPJ_UINT32 OVar8;
  OPJ_BOOL OVar9;
  int iVar10;
  uint uVar11;
  OPJ_BYTE *pOVar12;
  opj_image_comp_t *in_RCX;
  int iVar13;
  opj_image_comp_t *poVar14;
  int iVar15;
  long lVar16;
  opj_tcd *poVar17;
  undefined8 in_R8;
  opj_image_comp_t *poVar18;
  OPJ_BYTE *pOVar19;
  int iVar20;
  int iVar21;
  OPJ_BYTE *p_src;
  long lVar22;
  OPJ_UINT32 p_tile_index;
  ulong uVar23;
  opj_image_t *poVar24;
  opj_image_comp_t *local_70;
  char local_68;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bea,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2beb,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x2bec,
                  "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)")
    ;
  }
  poVar5 = p_j2k->m_tcd;
  OVar8 = (p_j2k->m_cp).tw * (p_j2k->m_cp).th;
  poVar18 = (opj_image_comp_t *)CONCAT71((int7)((ulong)in_R8 >> 8),1);
  if (OVar8 == 1) {
    in_RCX = (opj_image_comp_t *)poVar5->image;
    ppvVar1 = (void **)&in_RCX->x0;
    poVar18 = (opj_image_comp_t *)0x0;
    if ((ulong)*(uint *)ppvVar1 != 0) {
      in_RCX = *(opj_image_comp_t **)&in_RCX->prec;
      poVar14 = (opj_image_comp_t *)0x1;
      lVar16 = 0;
      do {
        if (((byte)*(code *)((long)&in_RCX->data + lVar16) & 0xf) != 0) {
          poVar14 = poVar18;
        }
        lVar16 = lVar16 + 0x40;
      } while ((ulong)*(uint *)ppvVar1 << 6 != lVar16);
      poVar18 = (opj_image_comp_t *)(ulong)((int)poVar14 == 0);
    }
  }
  if (OVar8 == 0) {
    p_src = (OPJ_BYTE *)0x0;
  }
  else {
    p_tile_index = 0;
    local_70 = (opj_image_comp_t *)0x0;
    p_src = (OPJ_BYTE *)0x0;
    do {
      OVar9 = opj_j2k_pre_write_tile
                        (p_j2k,p_tile_index,(opj_stream_private_t *)p_manager,
                         (opj_event_mgr_t *)in_RCX);
      if (OVar9 == 0) {
LAB_00113a29:
        OVar9 = 0;
        goto LAB_00113a2b;
      }
      poVar17 = p_j2k->m_tcd;
      local_68 = (char)poVar18;
      if (poVar17->image->numcomps != 0) {
        lVar16 = 0x30;
        lVar22 = 0;
        uVar23 = 0;
        do {
          poVar6 = poVar5->tcd_image->tiles->comps;
          if (local_68 == '\0') {
            *(undefined8 *)((long)&poVar6->data + lVar22) =
                 *(undefined8 *)((long)&poVar5->image->comps->dx + lVar16);
            *(undefined4 *)((long)&poVar6->ownsData + lVar22) = 0;
          }
          else {
            OVar9 = opj_alloc_tile_component_data
                              ((opj_tcd_tilecomp_t *)((long)&poVar6->x0 + lVar22));
            if (OVar9 == 0) {
              OVar9 = 0;
              opj_event_msg(p_manager,1,"Error allocating tile component data.");
              if (p_src == (OPJ_BYTE *)0x0) {
                return 0;
              }
              goto LAB_00113a30;
            }
          }
          uVar23 = uVar23 + 1;
          poVar17 = p_j2k->m_tcd;
          lVar22 = lVar22 + 0x70;
          lVar16 = lVar16 + 0x40;
        } while (uVar23 < poVar17->image->numcomps);
      }
      in_RCX = poVar18;
      poVar14 = (opj_image_comp_t *)opj_tcd_get_encoded_tile_size(poVar17);
      if (local_68 != '\0') {
        if (local_70 < poVar14) {
          pOVar12 = (OPJ_BYTE *)opj_realloc(p_src,(size_t)poVar14);
          pOVar19 = pOVar12;
          in_RCX = poVar14;
          if (pOVar12 == (OPJ_BYTE *)0x0) {
            if (p_src != (OPJ_BYTE *)0x0) {
              opj_free(p_src);
            }
            opj_event_msg(p_manager,1,"Not enough memory to encode all tiles\n");
            pOVar19 = p_src;
            in_RCX = local_70;
          }
          p_src = pOVar19;
          local_70 = in_RCX;
          if (pOVar12 == (OPJ_BYTE *)0x0) {
            return 0;
          }
        }
        if (p_src == (OPJ_BYTE *)0x0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x2c29,
                        "OPJ_BOOL opj_j2k_encode(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                       );
        }
        poVar17 = p_j2k->m_tcd;
        poVar24 = poVar17->image;
        if (poVar24->numcomps != 0) {
          uVar23 = 0;
          pOVar19 = p_src;
          do {
            poVar7 = poVar24->comps;
            iVar21 = ((poVar7[uVar23].prec >> 3) + 1) - (uint)((poVar7[uVar23].prec & 7) == 0);
            if (iVar21 == 3) {
              iVar21 = 4;
            }
            lVar16 = (long)(int)poVar7[uVar23].dx;
            if ((lVar16 == 0) || (lVar22 = (long)(int)poVar7[uVar23].dy, lVar22 == 0)) {
              __assert_fail("b",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                            ,0xa2,"OPJ_INT32 opj_int_ceildiv(OPJ_INT32, OPJ_INT32)");
            }
            poVar6 = poVar17->tcd_image->tiles->comps;
            iVar2 = poVar6[uVar23].x1;
            iVar3 = poVar6[uVar23].x0;
            iVar15 = poVar6[uVar23].y0;
            iVar20 = iVar2 - iVar3;
            iVar4 = poVar6[uVar23].y1;
            iVar10 = (int)((((long)(int)poVar24->x1 - (long)(int)poVar24->x0) + lVar16 + -1) /
                          lVar16);
            iVar13 = iVar4 - iVar15;
            uVar11 = iVar10 - iVar20;
            in_RCX = (opj_image_comp_t *)
                     (poVar7[uVar23].data +
                     (uint)((iVar15 - (int)(((int)poVar24->y0 + lVar22 + -1) / lVar22)) * iVar10 +
                           (iVar3 - (int)(((int)poVar24->x0 + lVar16 + -1) / lVar16))));
            if (iVar21 == 1) {
              if (poVar7[uVar23].sgnd == 0) {
                if (iVar4 != iVar15) {
                  iVar21 = 0;
                  do {
                    iVar15 = iVar20;
                    if (iVar2 != iVar3) {
                      do {
                        *pOVar19 = *(OPJ_BYTE *)&in_RCX->dx;
                        pOVar19 = pOVar19 + 1;
                        in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                        iVar15 = iVar15 + -1;
                      } while (iVar15 != 0);
                    }
                    in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar11 * 4);
                    iVar21 = iVar21 + 1;
                  } while (iVar21 != iVar13);
                }
              }
              else if (iVar4 != iVar15) {
                iVar21 = 0;
                do {
                  iVar15 = iVar20;
                  if (iVar2 != iVar3) {
                    do {
                      *pOVar19 = *(OPJ_BYTE *)&in_RCX->dx;
                      pOVar19 = pOVar19 + 1;
                      in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar11 * 4);
                  iVar21 = iVar21 + 1;
                } while (iVar21 != iVar13);
              }
            }
            else if (iVar21 == 2) {
              if (poVar7[uVar23].sgnd == 0) {
                if (iVar4 != iVar15) {
                  iVar21 = 0;
                  do {
                    iVar15 = iVar20;
                    if (iVar2 != iVar3) {
                      do {
                        ppvVar1 = (void **)&in_RCX->dx;
                        in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                        *(undefined2 *)pOVar19 = *(undefined2 *)ppvVar1;
                        pOVar19 = pOVar19 + 2;
                        iVar15 = iVar15 + -1;
                      } while (iVar15 != 0);
                    }
                    in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar11 * 4);
                    iVar21 = iVar21 + 1;
                  } while (iVar21 != iVar13);
                }
              }
              else if (iVar4 != iVar15) {
                iVar21 = 0;
                do {
                  iVar15 = iVar20;
                  if (iVar2 != iVar3) {
                    do {
                      ppvVar1 = (void **)&in_RCX->dx;
                      in_RCX = (opj_image_comp_t *)&in_RCX->dy;
                      *(undefined2 *)pOVar19 = *(undefined2 *)ppvVar1;
                      pOVar19 = pOVar19 + 2;
                      iVar15 = iVar15 + -1;
                    } while (iVar15 != 0);
                  }
                  in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar11 * 4);
                  iVar21 = iVar21 + 1;
                } while (iVar21 != iVar13);
              }
            }
            else if ((iVar21 == 4) && (iVar4 != iVar15)) {
              iVar21 = 0;
              do {
                if (iVar2 != iVar3) {
                  lVar16 = 0;
                  lVar22 = 0;
                  do {
                    *(undefined4 *)(pOVar19 + lVar22 * 4) =
                         *(undefined4 *)((long)&in_RCX->dx + lVar22 * 4);
                    lVar22 = lVar22 + 1;
                    lVar16 = lVar16 + -4;
                  } while (iVar20 != (int)lVar22);
                  pOVar19 = pOVar19 + -lVar16;
                  in_RCX = (opj_image_comp_t *)((long)in_RCX - lVar16);
                }
                in_RCX = (opj_image_comp_t *)((long)&in_RCX->dx + (ulong)uVar11 * 4);
                iVar21 = iVar21 + 1;
              } while (iVar21 != iVar13);
            }
            uVar23 = uVar23 + 1;
            poVar24 = poVar17->image;
          } while (uVar23 < poVar24->numcomps);
        }
        OVar9 = opj_tcd_copy_tile_data(p_j2k->m_tcd,p_src,(OPJ_SIZE_T)poVar14);
        if (OVar9 == 0) {
          OVar9 = 0;
          opj_event_msg(p_manager,1,"Size mismatch between tile data and sent data.");
          goto LAB_00113a30;
        }
      }
      OVar9 = opj_j2k_post_write_tile(p_j2k,p_stream,p_manager);
      if (OVar9 == 0) goto LAB_00113a29;
      p_tile_index = p_tile_index + 1;
    } while (p_tile_index != OVar8);
  }
  OVar9 = 1;
LAB_00113a2b:
  if (p_src != (OPJ_BYTE *)0x0) {
LAB_00113a30:
    opj_free(p_src);
  }
  return OVar9;
}

Assistant:

OPJ_BOOL opj_j2k_encode(opj_j2k_t * p_j2k,
                        opj_stream_private_t *p_stream,
                        opj_event_mgr_t * p_manager)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_tiles;
    OPJ_SIZE_T l_max_tile_size = 0, l_current_tile_size;
    OPJ_BYTE * l_current_data = 00;
    OPJ_BOOL l_reuse_data = OPJ_FALSE;
    opj_tcd_t* p_tcd = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    p_tcd = p_j2k->m_tcd;

    l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
    if (l_nb_tiles == 1) {
        l_reuse_data = OPJ_TRUE;
#ifdef __SSE__
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
            if (((size_t)l_img_comp->data & 0xFU) !=
                    0U) { /* tile data shall be aligned on 16 bytes */
                l_reuse_data = OPJ_FALSE;
            }
        }
#endif
    }
    for (i = 0; i < l_nb_tiles; ++i) {
        if (! opj_j2k_pre_write_tile(p_j2k, i, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }

        /* if we only have one tile, then simply set tile component data equal to image component data */
        /* otherwise, allocate the data */
        for (j = 0; j < p_j2k->m_tcd->image->numcomps; ++j) {
            opj_tcd_tilecomp_t* l_tilec = p_tcd->tcd_image->tiles->comps + j;
            if (l_reuse_data) {
                opj_image_comp_t * l_img_comp = p_tcd->image->comps + j;
                l_tilec->data  =  l_img_comp->data;
                l_tilec->ownsData = OPJ_FALSE;
            } else {
                if (! opj_alloc_tile_component_data(l_tilec)) {
                    opj_event_msg(p_manager, EVT_ERROR, "Error allocating tile component data.");
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    return OPJ_FALSE;
                }
            }
        }
        l_current_tile_size = opj_tcd_get_encoded_tile_size(p_j2k->m_tcd);
        if (!l_reuse_data) {
            if (l_current_tile_size > l_max_tile_size) {
                OPJ_BYTE *l_new_current_data = (OPJ_BYTE *) opj_realloc(l_current_data,
                                               l_current_tile_size);
                if (! l_new_current_data) {
                    if (l_current_data) {
                        opj_free(l_current_data);
                    }
                    opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to encode all tiles\n");
                    return OPJ_FALSE;
                }
                l_current_data = l_new_current_data;
                l_max_tile_size = l_current_tile_size;
            }
            if (l_current_data == NULL) {
                /* Should not happen in practice, but will avoid Coverity to */
                /* complain about a null pointer dereference */
                assert(0);
                return OPJ_FALSE;
            }

            /* copy image data (32 bit) to l_current_data as contiguous, all-component, zero offset buffer */
            /* 32 bit components @ 8 bit precision get converted to 8 bit */
            /* 32 bit components @ 16 bit precision get converted to 16 bit */
            opj_j2k_get_tile_data(p_j2k->m_tcd, l_current_data);

            /* now copy this data into the tile component */
            if (! opj_tcd_copy_tile_data(p_j2k->m_tcd, l_current_data,
                                         l_current_tile_size)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size mismatch between tile data and sent data.");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        }

        if (! opj_j2k_post_write_tile(p_j2k, p_stream, p_manager)) {
            if (l_current_data) {
                opj_free(l_current_data);
            }
            return OPJ_FALSE;
        }
    }

    if (l_current_data) {
        opj_free(l_current_data);
    }
    return OPJ_TRUE;
}